

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O0

void __thiscall nv::ColorBlock::diameterRange(ColorBlock *this,Color32 *start,Color32 *end)

{
  Color32 local_40;
  Color32 local_3c;
  uint local_38;
  uint local_34;
  uint dist;
  int j;
  int i;
  uint best_dist;
  Color32 c1;
  Color32 c0;
  Color32 *end_local;
  Color32 *start_local;
  ColorBlock *this_local;
  
  _c1 = end;
  Color32::Color32((Color32 *)&best_dist);
  Color32::Color32((Color32 *)&i);
  j = 0;
  for (dist = 0; local_34 = dist, (int)dist < 0x10; dist = dist + 1) {
    while (local_34 = local_34 + 1, (int)local_34 < 0x10) {
      Color32::Color32(&local_3c,this->m_color + (int)dist);
      Color32::Color32(&local_40,this->m_color + (int)local_34);
      local_38 = anon_unknown.dwarf_462837::colorDistance(&local_3c,&local_40);
      if ((uint)j < local_38) {
        best_dist = this->m_color[(int)dist].field_0.u;
        i = this->m_color[(int)local_34].field_0.u;
        j = local_38;
      }
    }
  }
  (start->field_0).u = best_dist;
  (_c1->field_0).u = i;
  return;
}

Assistant:

void ColorBlock::diameterRange(Color32 * start, Color32 * end) const
{
	nvDebugCheck(start != NULL);
	nvDebugCheck(end != NULL);
	
	Color32 c0, c1;
	uint best_dist = 0;
	
	for(int i = 0; i < 16; i++) {
		for (int j = i+1; j < 16; j++) {
			uint dist = colorDistance(m_color[i], m_color[j]);
			if( dist > best_dist ) {
				best_dist = dist;
				c0 = m_color[i];
				c1 = m_color[j];
			}
		}
	}
	
	*start = c0;
	*end = c1;
}